

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O2

bool IsSystem24Track(Track *track)

{
  pointer pSVar1;
  bool bVar2;
  int iVar3;
  uint8_t *puVar4;
  Sector *s;
  pointer this;
  
  iVar3 = Track::size(track);
  if (iVar3 == 7) {
    this = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
           super__Vector_impl_data._M_start;
    pSVar1 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar4 = "\x04\x04\x04\x04\x04\x03\x01";
    do {
      if (this == pSVar1) {
        if (opt.debug != 0) {
          util::operator<<((LogHelper *)&util::cout,(char (*) [26])"detected System-24 track\n");
          return true;
        }
        return true;
      }
      if (this->datarate != _500K) {
        return false;
      }
      if (this->encoding != MFM) {
        return false;
      }
      if ((this->header).size != (uint)*puVar4) {
        return false;
      }
      bVar2 = Sector::has_data(this);
      this = this + 1;
      puVar4 = puVar4 + 1;
    } while (bVar2);
  }
  return false;
}

Assistant:

bool IsSystem24Track(const Track& track)
{
    static const uint8_t sizes[] = { 4,4,4,4,4,3,1 };
    auto i = 0;

    if (track.size() != arraysize(sizes))
        return false;

    for (auto& s : track)
    {
        if (s.datarate != DataRate::_500K || s.encoding != Encoding::MFM ||
            s.header.size != sizes[i++] || !s.has_data())
            return false;
    }

    if (opt.debug) util::cout << "detected System-24 track\n";
    return true;
}